

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O2

void strict_fstream::detail::static_method_holder::check_mode(string *filename,openmode mode)

{
  Exception *pEVar1;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((mode & _S_trunc) == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
    if ((mode & (_S_out|_S_app)) == _S_app) {
      pEVar1 = (Exception *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_78,"strict_fstream: open(\'",&local_79);
      std::operator+(&local_58,&local_78,filename);
      std::operator+(&local_38,&local_58,"\'): mode error: app and not out");
      Exception::Exception(pEVar1,&local_38);
      __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
    }
  }
  else {
    if ((mode & _S_out) == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
      pEVar1 = (Exception *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_78,"strict_fstream: open(\'",&local_79);
      std::operator+(&local_58,&local_78,filename);
      std::operator+(&local_38,&local_58,"\'): mode error: trunc and not out");
      Exception::Exception(pEVar1,&local_38);
      __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
    }
    if ((mode & _S_app) != ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
      pEVar1 = (Exception *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_78,"strict_fstream: open(\'",&local_79);
      std::operator+(&local_58,&local_78,filename);
      std::operator+(&local_38,&local_58,"\'): mode error: trunc and app");
      Exception::Exception(pEVar1,&local_38);
      __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return;
}

Assistant:

static void check_mode(const std::string& filename, std::ios_base::openmode mode)
    {
        if ((mode & std::ios_base::trunc) && ! (mode & std::ios_base::out))
        {
            throw Exception(std::string("strict_fstream: open('") + filename + "'): mode error: trunc and not out");
        }
        else if ((mode & std::ios_base::app) && ! (mode & std::ios_base::out))
        {
            throw Exception(std::string("strict_fstream: open('") + filename + "'): mode error: app and not out");
        }
        else if ((mode & std::ios_base::trunc) && (mode & std::ios_base::app))
        {
            throw Exception(std::string("strict_fstream: open('") + filename + "'): mode error: trunc and app");
        }
     }